

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_group_begin_titled(nk_context *ctx,char *id,char *title,nk_flags flags)

{
  uint uVar1;
  nk_window *win;
  nk_table *pnVar2;
  long lVar3;
  nk_hash name;
  int iVar4;
  long lVar5;
  nk_uint *x_offset;
  nk_uint *y_offset;
  nk_table *pnVar6;
  nk_uint value;
  ulong uVar7;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4982,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4983,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4984,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  if (win->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4985,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  if (*id == '\0') {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    do {
      lVar3 = lVar5 + 1;
      lVar5 = lVar5 + 1;
    } while (id[lVar3] != '\0');
  }
  value = flags;
  name = nk_murmur_hash(id,(int)lVar5,2);
  pnVar6 = win->tables;
  for (pnVar2 = pnVar6; pnVar2 != (nk_table *)0x0; pnVar2 = pnVar2->next) {
    uVar7 = (ulong)pnVar2->size;
    if (uVar7 != 0) {
      x_offset = pnVar2->values;
      do {
        if (x_offset[-0x3b] == name) {
          uVar1 = win->seq;
          pnVar2->seq = uVar1;
          goto LAB_0011cad2;
        }
        x_offset = x_offset + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    value = (nk_uint)uVar7;
  }
  x_offset = nk_add_value(ctx,win,name,value);
  y_offset = nk_add_value(ctx,win,name + 1,value);
  *y_offset = 0;
  *x_offset = 0;
  goto LAB_0011cb04;
LAB_0011cad2:
  do {
    uVar7 = (ulong)pnVar6->size;
    if (uVar7 != 0) {
      y_offset = pnVar6->values;
      do {
        if (y_offset[-0x3b] == name + 1) {
          pnVar6->seq = uVar1;
          goto LAB_0011cb04;
        }
        y_offset = y_offset + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    pnVar6 = pnVar6->next;
  } while (pnVar6 != (nk_table *)0x0);
  y_offset = (nk_uint *)0x0;
LAB_0011cb04:
  iVar4 = nk_group_scrolled_offset_begin(ctx,x_offset,y_offset,title,flags);
  return iVar4;
}

Assistant:

NK_API int
nk_group_begin_titled(struct nk_context *ctx, const char *id,
    const char *title, nk_flags flags)
{
    int id_len;
    nk_hash id_hash;
    struct nk_window *win;
    nk_uint *x_offset;
    nk_uint *y_offset;

    NK_ASSERT(ctx);
    NK_ASSERT(id);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !id)
        return 0;

    /* find persistent group scrollbar value */
    win = ctx->current;
    id_len = (int)nk_strlen(id);
    id_hash = nk_murmur_hash(id, (int)id_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, id_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, id_hash, 0);
        y_offset = nk_add_value(ctx, win, id_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, id_hash+1);
    return nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
}